

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

ALCboolean alcMakeContextCurrent(ALCcontext *_ctx)

{
  ALCboolean b;
  DeviceWrapper *local_38;
  ALCcontext *local_30;
  ALCboolean retval;
  ContextWrapper *ctx;
  ALCcontext *_ctx_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alcMakeContextCurrent);
  IO_PTR(_ctx);
  if (_ctx == (ALCcontext *)0x0) {
    local_30 = (ALCcontext *)0x0;
  }
  else {
    local_30 = *(ALCcontext **)_ctx;
  }
  b = (*REAL_alcMakeContextCurrent)(local_30);
  IO_ALCBOOLEAN(b);
  if ((b != '\0') && (current_context = (ContextWrapper *)_ctx, _ctx != (ALCcontext *)0x0)) {
    check_context_static_state((ContextWrapper *)_ctx);
    check_context_state();
  }
  if (current_context == (ContextWrapper *)0x0) {
    local_38 = (DeviceWrapper *)0x0;
  }
  else {
    local_38 = current_context->device;
  }
  check_alc_error_events(local_38);
  check_al_async_states();
  APIUNLOCK();
  return b;
}

Assistant:

ALCboolean alcMakeContextCurrent(ALCcontext *_ctx)
{
    ContextWrapper *ctx = (ContextWrapper *) _ctx;
    ALCboolean retval;
    IO_START(alcMakeContextCurrent);
    IO_PTR(ctx);
    retval = REAL_alcMakeContextCurrent(ctx ? ctx->ctx : NULL);
    IO_ALCBOOLEAN(retval);
    if (retval) {
        current_context = ctx;
        if (ctx) {
            check_context_static_state(ctx);
            check_context_state();
        }
    }
    IO_END_ALC(current_context ? current_context->device : NULL);
    return retval;
}